

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O2

void __thiscall XmlRpc::XmlRpcValue::assertType(XmlRpcValue *this,Type t)

{
  string *this_00;
  allocator<char> local_39;
  string local_38 [32];
  
  if (this->_type == t) {
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"type error",&local_39);
  std::__cxx11::string::string(this_00,local_38);
  *(undefined4 *)(this_00 + 0x20) = 0xffffffff;
  __cxa_throw(this_00,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
}

Assistant:

void XmlRpcValue::assertType(Type t) const
  {
    if (_type != t)
      throw XmlRpcException("type error");
  }